

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O2

bool testValue(cmState *state,string *key,string *value,string *keyDescription,string *errorMessage)

{
  bool bVar1;
  char *pcVar2;
  size_type sVar3;
  string cachedValue;
  allocator local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pcVar2 = cmState::GetCacheEntryValue(state,key);
  if (pcVar2 == (char *)0x0) {
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    local_e8._M_string_length = 0;
    local_e8.field_2._M_local_buf[0] = '\0';
LAB_00467041:
    sVar3 = value->_M_string_length;
  }
  else {
    std::__cxx11::string::string((string *)&local_e8,pcVar2,(allocator *)&local_c8);
    sVar3 = value->_M_string_length;
    if (sVar3 != 0 && local_e8._M_string_length != 0) {
      bVar1 = std::operator!=(&local_e8,value);
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_a8,"\"",&local_e9);
        std::operator+(&local_88,&local_a8,key);
        std::operator+(&local_68,&local_88,"\" is set but incompatible with configured ");
        std::operator+(&local_48,&local_68,keyDescription);
        std::operator+(&local_c8,&local_48," value.");
        setErrorMessage(errorMessage,&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_a8);
        bVar1 = false;
        goto LAB_00467059;
      }
      goto LAB_00467041;
    }
  }
  bVar1 = true;
  if (sVar3 == 0) {
    std::__cxx11::string::_M_assign((string *)value);
  }
LAB_00467059:
  std::__cxx11::string::~string((string *)&local_e8);
  return bVar1;
}

Assistant:

static bool testValue(cmState* state, const std::string& key,
                      std::string& value, const std::string& keyDescription,
                      std::string* errorMessage)
{
  const char* entry = state->GetCacheEntryValue(key);
  const std::string cachedValue =
    entry == nullptr ? std::string() : std::string(entry);
  if (!cachedValue.empty() && !value.empty() && cachedValue != value) {
    setErrorMessage(errorMessage, std::string("\"") + key +
                      "\" is set but incompatible with configured " +
                      keyDescription + " value.");
    return false;
  }
  if (value.empty()) {
    value = cachedValue;
  }
  return true;
}